

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_83ee8::BuildContext::emitError(BuildContext *this,string *message)

{
  string local_60;
  allocator local_39;
  string local_38;
  string *local_18;
  string *message_local;
  BuildContext *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"error",&local_39);
  std::__cxx11::string::string((string *)&local_60,(string *)local_18);
  emitDiagnostic(this,&local_38,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__atomic_base<unsigned_int>::operator++(&(this->numErrors).super___atomic_base<unsigned_int>)
  ;
  return;
}

Assistant:

void emitError(std::string&& message) {
    emitDiagnostic("error", std::move(message));
    ++numErrors;
  }